

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void test_sort_helper(secp256k1_pubkey *pk,size_t *pk_order,size_t n_pk)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  uchar *p1;
  uchar *key32;
  uchar *keypair;
  undefined8 *extraout_RDX;
  undefined8 *puVar6;
  undefined8 *puVar7;
  size_t len;
  void *ndata;
  size_t msglen;
  long lVar8;
  uchar *msg;
  secp256k1_keypair *keypair_00;
  byte *nonce32;
  secp256k1_context *input32;
  int iVar9;
  uchar *xonly_pk32;
  uchar *puVar10;
  secp256k1_keypair *psVar11;
  secp256k1_xonly_pubkey *pubkey;
  uchar *algo;
  secp256k1_pubkey *pk_test [5];
  secp256k1_xonly_pubkey sStackY_268;
  uchar *puStackY_228;
  uchar *puStackY_220;
  uchar *puStackY_218;
  code *pcStackY_210;
  secp256k1_schnorrsig_extraparams sStack_1f8;
  undefined1 auStack_1d8 [64];
  undefined1 auStack_198 [160];
  byte abStack_f8 [64];
  undefined8 *puStack_b8;
  byte abStack_90 [32];
  byte abStack_70 [32];
  size_t sStack_50;
  secp256k1_pubkey *psStack_48;
  secp256k1_pubkey *local_38 [5];
  
  if (n_pk != 0) {
    sVar5 = 0;
    do {
      local_38[sVar5] = pk + pk_order[sVar5];
      sVar5 = sVar5 + 1;
    } while (n_pk != sVar5);
  }
  secp256k1_pubkey_sort(CTX,local_38,n_pk);
  if (n_pk != 0) {
    sVar5 = 0;
    puVar7 = extraout_RDX;
    do {
      lVar8 = 0;
      puVar6 = puVar7;
      do {
        puVar6 = (undefined8 *)((ulong)puVar6 & 0xffffffff);
        puVar7 = (undefined8 *)(ulong)((uint)local_38[sVar5]->data[lVar8] - (uint)pk->data[lVar8]);
        if (local_38[sVar5]->data[lVar8] != pk->data[lVar8]) goto LAB_0015ee3a;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      puVar7 = (undefined8 *)0x0;
LAB_0015ee3a:
      if ((int)puVar7 != 0) {
        test_sort_helper_cold_1();
        nonce32 = abStack_90;
        msg = (uchar *)*puVar6;
        key32 = (uchar *)puVar6[1];
        xonly_pk32 = (uchar *)puVar6[2];
        algo = (uchar *)puVar6[3];
        sStack_50 = n_pk;
        psStack_48 = pk;
        iVar3 = nonce_function_bip340
                          (abStack_90,msg,0x20,key32,xonly_pk32,algo,0xd,(void *)puVar6[4]);
        if (iVar3 == 0) {
          nonce_function_bip340_bitflip_cold_3();
        }
        else {
          secp256k1_testrand_flip((uchar *)puVar6[lVar8],len);
          nonce32 = abStack_70;
          msg = (uchar *)*puVar6;
          key32 = (uchar *)puVar6[1];
          xonly_pk32 = (uchar *)puVar6[2];
          algo = (uchar *)puVar6[3];
          lVar8 = 0x20;
          uVar4 = nonce_function_bip340
                            (nonce32,msg,0x20,key32,xonly_pk32,algo,0xd,(void *)puVar6[4]);
          if (uVar4 != 0) goto LAB_0015eecf;
        }
        nonce_function_bip340_bitflip_cold_2();
        goto LAB_0015ef0b;
      }
      sVar5 = sVar5 + 1;
      pk = pk + 1;
    } while (sVar5 != n_pk);
  }
  return;
  while (lVar8 = lVar8 + 1, lVar8 != 0x40) {
LAB_0015eecf:
    key32 = (uchar *)(ulong)uVar4;
    bVar1 = abStack_90[lVar8];
    msg = (uchar *)(ulong)bVar1;
    iVar3 = (uint)abStack_90[lVar8 + -0x20] - (uint)bVar1;
    if (abStack_90[lVar8 + -0x20] != bVar1) goto LAB_0015eef3;
  }
  iVar3 = 0;
LAB_0015eef3:
  if (iVar3 != 0) {
    return;
  }
LAB_0015ef0b:
  nonce_function_bip340_bitflip_cold_1();
  sStack_1f8.magic[0] = 0xda;
  sStack_1f8.magic[1] = 'o';
  sStack_1f8.magic[2] = 0xb3;
  sStack_1f8.magic[3] = 0x8c;
  sStack_1f8._4_4_ = 0;
  sStack_1f8.noncefp = (secp256k1_nonce_function_hardened)0x0;
  keypair_00 = (secp256k1_keypair *)(auStack_198 + 0x40);
  pcStackY_210 = (code *)0x15ef57;
  keypair = key32;
  input32 = CTX;
  puVar10 = xonly_pk32;
  puStack_b8 = puVar6;
  iVar3 = secp256k1_keypair_create(CTX,keypair_00,nonce32);
  iVar9 = (int)puVar10;
  if (iVar3 == 0) {
    pcStackY_210 = (code *)0x15f0d1;
    test_schnorrsig_bip_vectors_check_signing_cold_9();
LAB_0015f0d1:
    pcStackY_210 = (code *)0x15f0d6;
    test_schnorrsig_bip_vectors_check_signing_cold_8();
LAB_0015f0d6:
    pcStackY_210 = (code *)0x15f0db;
    test_schnorrsig_bip_vectors_check_signing_cold_1();
LAB_0015f0db:
    pcStackY_210 = (code *)0x15f0e0;
    test_schnorrsig_bip_vectors_check_signing_cold_6();
LAB_0015f0e0:
    pcStackY_210 = (code *)0x15f0e5;
    test_schnorrsig_bip_vectors_check_signing_cold_5();
LAB_0015f0e5:
    pcStackY_210 = (code *)0x15f0ea;
    test_schnorrsig_bip_vectors_check_signing_cold_3();
LAB_0015f0ea:
    pcStackY_210 = (code *)0x15f0ef;
    test_schnorrsig_bip_vectors_check_signing_cold_4();
  }
  else {
    keypair_00 = (secp256k1_keypair *)auStack_1d8;
    psVar11 = (secp256k1_keypair *)(auStack_198 + 0x40);
    pcStackY_210 = (code *)0x15ef83;
    keypair = xonly_pk32;
    input32 = CTX;
    iVar3 = secp256k1_schnorrsig_sign_custom
                      (CTX,(uchar *)keypair_00,key32,(size_t)xonly_pk32,psVar11,&sStack_1f8);
    iVar9 = (int)psVar11;
    if (iVar3 == 0) goto LAB_0015f0d1;
    keypair = (uchar *)0x0;
    do {
      bVar1 = auStack_1d8[(long)keypair];
      keypair_00 = (secp256k1_keypair *)(ulong)bVar1;
      bVar2 = algo[(long)keypair];
      input32 = (secp256k1_context *)(ulong)bVar2;
      iVar3 = (uint)bVar1 - (uint)bVar2;
      if (bVar1 != bVar2) goto LAB_0015efb0;
      keypair = keypair + 1;
    } while (keypair != (uchar *)0x40);
    iVar3 = 0;
LAB_0015efb0:
    if (iVar3 != 0) goto LAB_0015f0d6;
    if (xonly_pk32 != (uchar *)0x20) {
LAB_0015f031:
      keypair_00 = (secp256k1_keypair *)abStack_f8;
      pcStackY_210 = (code *)0x15f048;
      input32 = CTX;
      iVar3 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)keypair_00,msg);
      if (iVar3 == 0) goto LAB_0015f0db;
      keypair_00 = (secp256k1_keypair *)auStack_198;
      keypair = auStack_198 + 0x40;
      pcStackY_210 = (code *)0x15f06b;
      input32 = CTX;
      iVar3 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)keypair_00,(int *)0x0,
                         (secp256k1_keypair *)keypair);
      if (iVar3 == 0) goto LAB_0015f0e0;
      keypair = (uchar *)0x0;
      do {
        bVar1 = auStack_198[(long)keypair];
        keypair_00 = (secp256k1_keypair *)(ulong)bVar1;
        bVar2 = abStack_f8[(long)keypair];
        input32 = (secp256k1_context *)(ulong)bVar2;
        iVar3 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_0015f097;
        keypair = keypair + 1;
      } while (keypair != (uchar *)0x40);
      iVar3 = 0;
LAB_0015f097:
      if (iVar3 != 0) goto LAB_0015f0e5;
      keypair_00 = (secp256k1_keypair *)auStack_1d8;
      pubkey = (secp256k1_xonly_pubkey *)auStack_198;
      pcStackY_210 = (code *)0x15f0b7;
      keypair = xonly_pk32;
      input32 = CTX;
      iVar3 = secp256k1_schnorrsig_verify(CTX,(uchar *)keypair_00,key32,(size_t)xonly_pk32,pubkey);
      iVar9 = (int)pubkey;
      if (iVar3 != 0) {
        return;
      }
      goto LAB_0015f0ea;
    }
    keypair_00 = (secp256k1_keypair *)auStack_1d8;
    auStack_1d8[0x30] = '\0';
    auStack_1d8[0x31] = '\0';
    auStack_1d8[0x32] = '\0';
    auStack_1d8[0x33] = '\0';
    auStack_1d8[0x34] = '\0';
    auStack_1d8[0x35] = '\0';
    auStack_1d8[0x36] = '\0';
    auStack_1d8[0x37] = '\0';
    auStack_1d8[0x38] = '\0';
    auStack_1d8[0x39] = '\0';
    auStack_1d8[0x3a] = '\0';
    auStack_1d8[0x3b] = '\0';
    auStack_1d8[0x3c] = '\0';
    auStack_1d8[0x3d] = '\0';
    auStack_1d8[0x3e] = '\0';
    auStack_1d8[0x3f] = '\0';
    auStack_1d8[0x20] = '\0';
    auStack_1d8[0x21] = '\0';
    auStack_1d8[0x22] = '\0';
    auStack_1d8[0x23] = '\0';
    auStack_1d8[0x24] = '\0';
    auStack_1d8[0x25] = '\0';
    auStack_1d8[0x26] = '\0';
    auStack_1d8[0x27] = '\0';
    auStack_1d8[0x28] = '\0';
    auStack_1d8[0x29] = '\0';
    auStack_1d8[0x2a] = '\0';
    auStack_1d8[0x2b] = '\0';
    auStack_1d8[0x2c] = '\0';
    auStack_1d8[0x2d] = '\0';
    auStack_1d8[0x2e] = '\0';
    auStack_1d8[0x2f] = '\0';
    auStack_1d8[0x10] = '\0';
    auStack_1d8[0x11] = '\0';
    auStack_1d8[0x12] = '\0';
    auStack_1d8[0x13] = '\0';
    auStack_1d8[0x14] = '\0';
    auStack_1d8[0x15] = '\0';
    auStack_1d8[0x16] = '\0';
    auStack_1d8[0x17] = '\0';
    auStack_1d8[0x18] = '\0';
    auStack_1d8[0x19] = '\0';
    auStack_1d8[0x1a] = '\0';
    auStack_1d8[0x1b] = '\0';
    auStack_1d8[0x1c] = '\0';
    auStack_1d8[0x1d] = '\0';
    auStack_1d8[0x1e] = '\0';
    auStack_1d8[0x1f] = '\0';
    auStack_1d8[0] = '\0';
    auStack_1d8[1] = '\0';
    auStack_1d8[2] = '\0';
    auStack_1d8[3] = '\0';
    auStack_1d8[4] = '\0';
    auStack_1d8[5] = '\0';
    auStack_1d8[6] = '\0';
    auStack_1d8[7] = '\0';
    auStack_1d8[8] = '\0';
    auStack_1d8[9] = '\0';
    auStack_1d8[10] = '\0';
    auStack_1d8[0xb] = '\0';
    auStack_1d8[0xc] = '\0';
    auStack_1d8[0xd] = '\0';
    auStack_1d8[0xe] = '\0';
    auStack_1d8[0xf] = '\0';
    psVar11 = (secp256k1_keypair *)(auStack_198 + 0x40);
    keypair = (uchar *)0x20;
    pcStackY_210 = (code *)0x15effc;
    input32 = CTX;
    iVar3 = secp256k1_schnorrsig_sign_internal
                      (CTX,(uchar *)keypair_00,key32,0x20,psVar11,nonce_function_bip340,ndata);
    iVar9 = (int)psVar11;
    if (iVar3 != 0) {
      keypair = (uchar *)0x0;
      do {
        bVar1 = auStack_1d8[(long)keypair];
        keypair_00 = (secp256k1_keypair *)(ulong)bVar1;
        bVar2 = algo[(long)keypair];
        input32 = (secp256k1_context *)(ulong)bVar2;
        iVar3 = (uint)bVar1 - (uint)bVar2;
        if (bVar1 != bVar2) goto LAB_0015f029;
        keypair = keypair + 1;
      } while (keypair != (uchar *)0x40);
      iVar3 = 0;
LAB_0015f029:
      if (iVar3 != 0) goto LAB_0015f0f4;
      goto LAB_0015f031;
    }
  }
  pcStackY_210 = (code *)0x15f0f4;
  test_schnorrsig_bip_vectors_check_signing_cold_7();
LAB_0015f0f4:
  pcStackY_210 = test_schnorrsig_bip_vectors_check_verify;
  test_schnorrsig_bip_vectors_check_signing_cold_2();
  puStackY_228 = xonly_pk32;
  puStackY_220 = algo;
  puStackY_218 = key32;
  pcStackY_210 = (code *)msg;
  iVar3 = secp256k1_xonly_pubkey_parse(CTX,&sStackY_268,(uchar *)input32);
  if (iVar3 == 0) {
    test_schnorrsig_bip_vectors_check_verify_cold_2();
  }
  else {
    iVar3 = secp256k1_schnorrsig_verify(CTX,keypair,keypair_00->data,msglen,&sStackY_268);
    if (iVar3 == iVar9) {
      return;
    }
  }
  test_schnorrsig_bip_vectors_check_verify_cold_1();
  return;
}

Assistant:

static void test_sort_helper(secp256k1_pubkey *pk, size_t *pk_order, size_t n_pk) {
    size_t i;
    const secp256k1_pubkey *pk_test[5];

    for (i = 0; i < n_pk; i++) {
        pk_test[i] = &pk[pk_order[i]];
    }
    secp256k1_pubkey_sort(CTX, pk_test, n_pk);
    for (i = 0; i < n_pk; i++) {
        CHECK(secp256k1_memcmp_var(pk_test[i], &pk[i], sizeof(*pk_test[i])) == 0);
    }
}